

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O0

size_t pstore::serialize::string_helper::read_length<pstore::serialize::archive::database_reader&>
                 (database_reader *archive)

{
  undefined8 uVar1;
  uint size;
  pointer pvVar2;
  iterator in;
  size_type sVar3;
  uint64_t uVar4;
  span<unsigned_char,__1L> sVar5;
  uint varint_length;
  undefined1 local_19 [8];
  array<unsigned_char,_9UL> encoded_length;
  database_reader *archive_local;
  
  encoded_length._M_elems._1_8_ = archive;
  memset(local_19,0,9);
  uVar1 = encoded_length._M_elems._1_8_;
  pvVar2 = std::array<unsigned_char,_9UL>::data((array<unsigned_char,_9UL> *)local_19);
  sVar5 = gsl::make_span<unsigned_char>(pvVar2,2);
  read_uninit<pstore::serialize::archive::database_reader&,unsigned_char,_1l>
            ((database_reader *)uVar1,sVar5);
  in = std::begin<std::array<unsigned_char,9ul>>((array<unsigned_char,_9UL> *)local_19);
  size = varint::decode_size<unsigned_char*>(in);
  if (size == 0) {
    assert_failed("varint_length > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                  ,0x54);
  }
  if (2 < size) {
    sVar3 = std::array<unsigned_char,_9UL>::size((array<unsigned_char,_9UL> *)local_19);
    uVar1 = encoded_length._M_elems._1_8_;
    if (sVar3 < size) {
      assert_failed("varint_length <= encoded_length.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                    ,0x58);
    }
    pvVar2 = std::array<unsigned_char,_9UL>::data((array<unsigned_char,_9UL> *)local_19);
    sVar5 = gsl::make_span<unsigned_char>(pvVar2 + 2,(ulong)(size - 2));
    read_uninit<pstore::serialize::archive::database_reader&,unsigned_char,_1l>
              ((database_reader *)uVar1,sVar5);
  }
  pvVar2 = std::array<unsigned_char,_9UL>::data((array<unsigned_char,_9UL> *)local_19);
  uVar4 = varint::decode<unsigned_char*>(pvVar2,size);
  return uVar4;
}

Assistant:

static std::size_t read_length (Archive && archive) {
                std::array<std::uint8_t, varint::max_output_length> encoded_length{{0}};
                // First read the two initial bytes. These contain the variable length value
                // but might not be enough for the entire value.
                static_assert (varint::max_output_length >= 2,
                               "maximum encoded varint length must be >= 2");
                serialize::read_uninit (archive, gsl::make_span (encoded_length.data (), 2));

                auto const varint_length = varint::decode_size (std::begin (encoded_length));
                PSTORE_ASSERT (varint_length > 0);
                // Was that initial read of 2 bytes enough? If not get the rest of the
                // length value.
                if (varint_length > 2) {
                    PSTORE_ASSERT (varint_length <= encoded_length.size ());
                    serialize::read_uninit (
                        archive, gsl::make_span (encoded_length.data () + 2, varint_length - 2));
                }

                return varint::decode (encoded_length.data (), varint_length);
            }